

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  ostream *poVar2;
  ColourImpl *pCVar3;
  pointer pMVar4;
  undefined4 in_register_00000034;
  char local_41;
  pluralise local_40;
  
  pMVar4 = (this->itMessage)._M_current;
  pMVar1 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar4 != pMVar1) {
    poVar2 = this->stream;
    pCVar3 = this->colourImpl;
    (*pCVar3->_vptr_ColourImpl[2])(pCVar3,CONCAT44(in_register_00000034,colour));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," with ",6);
    local_40.m_count = ((long)pMVar1 - (long)pMVar4 >> 3) * -0x71c71c71c71c71c7;
    local_40.m_label.m_start = "message";
    local_40.m_label.m_size = 7;
    operator<<(poVar2,&local_40);
    local_41 = ':';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_41,1);
    (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
    pMVar4 = (this->itMessage)._M_current;
    while (pMVar4 != pMVar1) {
      if ((this->printInfoMessages == false) && (pMVar4->type == Info)) {
        pMVar4 = pMVar4 + 1;
        (this->itMessage)._M_current = pMVar4;
      }
      else {
        printMessage(this);
        pMVar4 = (this->itMessage)._M_current;
        if (pMVar4 != pMVar1) {
          poVar2 = this->stream;
          pCVar3 = this->colourImpl;
          (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0x17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," and",4);
          (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
          pMVar4 = (this->itMessage)._M_current;
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = compactDimColour) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(itEnd - itMessage);

        stream << colourImpl->guardColour( colour ) << " with "
               << pluralise( N, "message"_sr ) << ':';

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    stream << colourImpl->guardColour(compactDimColour) << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }